

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O0

int32_t buckets_needed_to_cover_value(int64_t value,int32_t sub_bucket_count,int32_t unit_magnitude)

{
  int local_2c;
  long lStack_28;
  int32_t buckets_needed;
  int64_t smallest_untrackable_value;
  int32_t unit_magnitude_local;
  int32_t sub_bucket_count_local;
  int64_t value_local;
  
  lStack_28 = (long)sub_bucket_count << ((byte)unit_magnitude & 0x3f);
  local_2c = 1;
  while( true ) {
    if (value < lStack_28) {
      return local_2c;
    }
    if (0x3fffffffffffffff < lStack_28) break;
    lStack_28 = lStack_28 << 1;
    local_2c = local_2c + 1;
  }
  return local_2c + 1;
}

Assistant:

static int32_t buckets_needed_to_cover_value(int64_t value, int32_t sub_bucket_count, int32_t unit_magnitude)
{
    int64_t smallest_untrackable_value = ((int64_t) sub_bucket_count) << unit_magnitude;
    int32_t buckets_needed = 1;
    while (smallest_untrackable_value <= value)
    {
        if (smallest_untrackable_value > INT64_MAX / 2)
        {
            return buckets_needed + 1;
        }
        smallest_untrackable_value <<= 1;
        buckets_needed++;
    }

    return buckets_needed;
}